

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

image * __thiscall
basisu::image::fill_box_alpha(image *this,uint32_t x,uint32_t y,uint32_t w,uint32_t h,color_rgba *c)

{
  uint in_ECX;
  image *in_RDI;
  uint in_R8D;
  image *in_R9;
  uint32_t ix;
  uint32_t iy;
  uint y_00;
  uint x_00;
  
  for (x_00 = 0; x_00 < in_R8D; x_00 = x_00 + 1) {
    for (y_00 = 0; y_00 < in_ECX; y_00 = y_00 + 1) {
      set_clipped_alpha(in_R9,x_00,y_00,(color_rgba *)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

image& fill_box_alpha(uint32_t x, uint32_t y, uint32_t w, uint32_t h, const color_rgba& c)
		{
			for (uint32_t iy = 0; iy < h; iy++)
				for (uint32_t ix = 0; ix < w; ix++)
					set_clipped_alpha(x + ix, y + iy, c);
			return *this;
		}